

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigmund~.c
# Opt level: O2

t_int * sigmund_perform(t_int *w)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  
  lVar4 = w[1];
  iVar1 = (int)w[3];
  if (*(int *)(lVar4 + 0x70) % iVar1 == 0) {
    if (*(int *)(lVar4 + 0x6c) < 1) {
      iVar2 = *(int *)(lVar4 + 0x68);
      iVar3 = *(int *)(lVar4 + 0x54);
      if (iVar2 != iVar3) {
        lVar5 = w[2];
        lVar6 = *(long *)(lVar4 + 0x60);
        lVar7 = 0;
        iVar8 = 0;
        if (0 < iVar1) {
          iVar8 = iVar1;
        }
        for (; iVar8 != (int)lVar7; lVar7 = lVar7 + 1) {
          *(undefined4 *)((long)iVar2 * 4 + lVar6 + lVar7 * 4) = *(undefined4 *)(lVar5 + lVar7 * 4);
        }
        *(int *)(lVar4 + 0x68) = iVar2 + iVar1;
        if (iVar2 + iVar1 == iVar3) {
          clock_delay(*(_clock **)(lVar4 + 0x30),0.0);
        }
      }
    }
    else {
      *(int *)(lVar4 + 0x6c) = *(int *)(lVar4 + 0x6c) - iVar1;
    }
  }
  return w + 4;
}

Assistant:

static t_int *sigmund_perform(t_int *w)
{
    t_sigmund *x = (t_sigmund *)(w[1]);
    t_sample *in = (t_sample *)(w[2]);
    int n = (int)(w[3]);

    if (x->x_hop % n)
        return (w+4);
    if (x->x_countdown > 0)
        x->x_countdown -= n;
    else if (x->x_infill != x->x_npts)
    {
        int j;
        t_float *fp = x->x_inbuf + x->x_infill;
        for (j = 0; j < n; j++)
            *fp++ = *in++;
        x->x_infill += n;
        if (x->x_infill == x->x_npts)
            clock_delay(x->x_clock, 0);
    }
    return (w+4);
}